

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export-lora.cpp
# Opt level: O2

void __thiscall lora_merge_ctx::copy_tensor(lora_merge_ctx *this,ggml_tensor *base)

{
  long lVar1;
  string local_60;
  string local_40;
  
  ggml_ne_string_abi_cxx11_(&local_40,base);
  printf("%s :  %s [%s]\n","copy_tensor",base->name,local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  lVar1 = ggml_nbytes(base);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,base->name,(allocator<char> *)&local_40);
  file_input::read_tensor_data(&this->base_model,&local_60,&this->read_buf);
  std::__cxx11::string::~string((string *)&local_60);
  std::ostream::write((char *)&this->fout,
                      (long)(this->read_buf).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  zeros(&this->fout,(lVar1 + 0x1fU & 0xffffffffffffffe0) - lVar1);
  return;
}

Assistant:

void copy_tensor(struct ggml_tensor * base) {
        printf("%s :  %s [%s]\n", __func__, base->name, ggml_ne_string(base).c_str());
        size_t len = ggml_nbytes(base);
        base_model.read_tensor_data(base->name, read_buf);
        fout.write((char* )read_buf.data(), len);
        zeros(fout, GGML_PAD(len, GGUF_DEFAULT_ALIGNMENT) - len);
    }